

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O1

SourceLoc * __thiscall
MiniScript::Context::GetSourceLoc(SourceLoc *__return_storage_ptr__,Context *this)

{
  long *plVar1;
  long lVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  StringStorage *pSVar4;
  TACLine *pTVar5;
  unsigned_long uVar6;
  
  lVar2 = this->lineNum;
  if (-1 < lVar2) {
    pLVar3 = (this->code).ls;
    if (pLVar3 == (ListStorage<MiniScript::TACLine> *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (pLVar3->super_SimpleVector<MiniScript::TACLine>).mQtyItems;
    }
    if (lVar2 < (long)uVar6) {
      if (pLVar3 == (ListStorage<MiniScript::TACLine> *)0x0) {
        _Error("Assert failed: ls",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
               ,0x3b);
      }
      pLVar3 = (this->code).ls;
      if (lVar2 < (long)(pLVar3->super_SimpleVector<MiniScript::TACLine>).mQtyItems) {
        pTVar5 = (pLVar3->super_SimpleVector<MiniScript::TACLine>).mBuf + lVar2;
      }
      else {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        pTVar5 = (pLVar3->super_SimpleVector<MiniScript::TACLine>).mBuf;
      }
      (__return_storage_ptr__->context).isTemp = false;
      pSVar4 = (pTVar5->location).context.ss;
      (__return_storage_ptr__->context).ss = pSVar4;
      if (pSVar4 != (StringStorage *)0x0) {
        plVar1 = &(pSVar4->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
      __return_storage_ptr__->lineNum = (pTVar5->location).lineNum;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->context).ss = (StringStorage *)0x0;
  (__return_storage_ptr__->context).isTemp = false;
  __return_storage_ptr__->lineNum = 0;
  return __return_storage_ptr__;
}

Assistant:

SourceLoc Context::GetSourceLoc() {
		if (lineNum < 0 || lineNum >= code.Count()) {
			return SourceLoc();
		}
		return code[lineNum].location;
	}